

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O3

uint128 * __thiscall trng::portable_impl::uint128::operator>>=(uint128 *this,int s)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  
  uVar5 = this->m_lo;
  uVar1 = this->m_hi;
  bVar4 = (byte)s;
  if (s < 0) {
    if ((uint)-s < 0x40) {
      bVar2 = (byte)-s;
      uVar3 = uVar1 << (bVar2 & 0x3f) | uVar5 >> (bVar4 & 0x3f);
      uVar5 = uVar5 << (bVar2 & 0x3f);
    }
    else {
      uVar3 = uVar5 << (-bVar4 & 0x3f);
      uVar5 = 0;
    }
  }
  else {
    uVar3 = uVar1;
    if (s != 0) {
      if ((uint)s < 0x40) {
        uVar3 = uVar1 >> (bVar4 & 0x3f);
        uVar5 = uVar5 >> (bVar4 & 0x3f) | uVar1 << 0x40 - (bVar4 & 0x3f);
      }
      else {
        uVar5 = uVar1 >> (bVar4 & 0x3f);
        uVar3 = 0;
      }
    }
  }
  this->m_lo = uVar5;
  this->m_hi = uVar3;
  return this;
}

Assistant:

uint128 &operator>>=(int s) {
        const uint128 result(*this >> s);
        *this = result;
        return *this;
      }